

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,undefined4 param_2)

{
  char *pcVar1;
  char cVar2;
  
  switch(param_2) {
  case 0:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'b';
    break;
  case 1:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'b';
    goto LAB_0013016e;
  case 2:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    break;
  case 3:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    goto LAB_0013016e;
  case 4:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    cVar2 = 's';
    goto LAB_0013010a;
  case 5:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 's';
    goto LAB_0013016e;
  case 6:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'a';
    break;
  case 7:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'a';
    goto LAB_0013016e;
  case 8:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'w';
    break;
  case 9:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'w';
    goto LAB_0013016e;
  case 10:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'i';
    break;
  case 0xb:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'i';
    goto LAB_0013016e;
  case 0xc:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
    break;
  case 0xd:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
LAB_0013016e:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'c';
    return this;
  case 0xe:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'c';
    break;
  case 0xf:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    cVar2 = 'c';
LAB_0013010a:
    *pcVar1 = cVar2;
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = cVar2;
    return this;
  default:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '?';
    return this;
  }
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = 's';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pcc pcc)
{
    switch (pcc.raw) {

        case 0:  *this << "bs"; break;
        case 1:  *this << "bc"; break;
        case 2:  *this << "ls"; break;
        case 3:  *this << "lc"; break;
        case 4:  *this << "ss"; break;
        case 5:  *this << "sc"; break;
        case 6:  *this << "as"; break;
        case 7:  *this << "ac"; break;
        case 8:  *this << "ws"; break;
        case 9:  *this << "wc"; break;
        case 10: *this << "is"; break;
        case 11: *this << "ic"; break;
        case 12: *this << "gs"; break;
        case 13: *this << "gc"; break;
        case 14: *this << "cs"; break;
        case 15: *this << "cc"; break;

        default:
            *this << "?";
    }
    return *this;
}